

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

string * __thiscall Lexer::trim(string *__return_storage_ptr__,Lexer *this,string *s)

{
  bool bVar1;
  int iVar2;
  difference_type dVar3;
  reference pcVar4;
  bool bVar5;
  allocator<char> local_69;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  const_iterator end;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  const_iterator start;
  string *s_local;
  Lexer *this_local;
  
  start._M_current = (char *)s;
  local_28._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    local_30._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    bVar5 = false;
    if (bVar1) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_28);
      iVar2 = isspace((int)*pcVar4);
      bVar5 = iVar2 != 0;
    }
    if (!bVar5) break;
    end._M_current =
         (char *)__gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&local_28,0);
  }
  local_40._M_current = (char *)std::__cxx11::string::end();
  do {
    local_48 = (char *)__gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator--(&local_40,0);
    local_50 = local_28._M_current;
    local_58 = local_40._M_current;
    dVar3 = std::distance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (local_28,local_40);
    bVar5 = false;
    if (0 < dVar3) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_40);
      iVar2 = isspace((int)*pcVar4);
      bVar5 = iVar2 != 0;
    }
  } while (bVar5);
  local_60._M_current = local_28._M_current;
  local_68 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(&local_40,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((string *)__return_storage_ptr__,local_60,local_68,&local_69);
  std::allocator<char>::~allocator(&local_69);
  return __return_storage_ptr__;
}

Assistant:

string Lexer::trim(const std::string &s) {
  auto start = s.begin();
  while (start != s.end() && std::isspace(*start)) {
    start++;
  }
  auto end = s.end();
  do {
    end--;
  } while (std::distance(start, end) > 0 && std::isspace(*end));
  return std::string(start, end + 1);
}